

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::ParseFromBoundedZeroCopyStream
          (MessageLite *this,ZeroCopyInputStream *input,int size)

{
  bool bVar1;
  int iVar2;
  CodedInputStream decoder;
  CodedInputStream CStack_68;
  
  io::CodedInputStream::CodedInputStream(&CStack_68,input);
  io::CodedInputStream::PushLimit(&CStack_68,size);
  bVar1 = ParseFromCodedStream(this,&CStack_68);
  if ((bVar1) && (CStack_68.legitimate_message_end_ == true)) {
    iVar2 = io::CodedInputStream::BytesUntilLimit(&CStack_68);
    bVar1 = iVar2 == 0;
  }
  else {
    bVar1 = false;
  }
  io::CodedInputStream::~CodedInputStream(&CStack_68);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFromBoundedZeroCopyStream(
    io::ZeroCopyInputStream* input, int size) {
  io::CodedInputStream decoder(input);
  decoder.PushLimit(size);
  return ParseFromCodedStream(&decoder) &&
         decoder.ConsumedEntireMessage() &&
         decoder.BytesUntilLimit() == 0;
}